

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_suite.cpp
# Opt level: O3

void __thiscall parser_suite::test_empty::test_method(test_empty *this)

{
  int iVar1;
  long *local_218 [2];
  long local_208 [2];
  char *local_1f8;
  undefined1 *local_1f0;
  char input [1];
  undefined **local_1e0;
  undefined1 local_1d8;
  undefined8 *local_1d0;
  char *local_1c8;
  undefined **local_1c0;
  undefined1 local_1b8;
  undefined8 *local_1b0;
  char **local_1a8;
  view_type local_1a0;
  undefined8 *local_190;
  undefined1 **local_188;
  undefined1 local_180 [8];
  undefined8 local_178;
  shared_count sStack_170;
  char *local_168;
  char *local_160;
  parser parser;
  char *local_c0;
  char *local_b8;
  undefined1 *local_b0;
  undefined1 *local_a8;
  char *local_a0;
  char *local_98;
  undefined1 *local_90;
  undefined1 *local_88;
  char *local_80;
  char *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  local_1a0.ptr_ = input;
  input[0] = '\0';
  local_1a0.len_ = strlen(local_1a0.ptr_);
  parser.current_scheme.ptr_ = (char *)0x0;
  parser.current_scheme.len_ = 0;
  parser.current_authority.ptr_ = (char *)0x0;
  parser.current_authority.len_ = 0;
  parser.current_userinfo.ptr_ = (char *)0x0;
  parser.current_userinfo.len_ = 0;
  parser.current_host.ptr_ = (char *)0x0;
  parser.current_host.len_ = 0;
  parser.current_port.ptr_ = (char *)0x0;
  parser.current_port.len_ = 0;
  parser.current_path.ptr_ = (char *)0x0;
  parser.current_path.len_ = 0;
  parser.current_query.ptr_ = (char *)0x0;
  parser.current_query.len_ = 0;
  parser.current_fragment.ptr_ = (char *)0x0;
  parser.current_fragment.len_ = 0;
  trial::url::basic_parser<char>::parse(&parser,&local_1a0);
  local_40 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/parser_suite.cpp";
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x17);
  local_1d8 = 0;
  local_1e0 = &PTR__lazy_ostream_00186288;
  local_1d0 = &boost::unit_test::lazy_ostream::inst;
  local_1c8 = "";
  local_218[0] = local_208;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_218,parser.current_scheme.ptr_,
             parser.current_scheme.ptr_ + parser.current_scheme.len_);
  iVar1 = std::__cxx11::string::compare((char *)local_218);
  local_180[0] = iVar1 == 0;
  local_178 = 0;
  sStack_170.pi_ = (sp_counted_base *)0x0;
  local_168 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/parser_suite.cpp";
  local_160 = "";
  local_188 = &local_1f0;
  local_1a0.len_ = local_1a0.len_ & 0xffffffffffffff00;
  local_1a0.ptr_ = (char *)&PTR__lazy_ostream_001862d8;
  local_190 = &boost::unit_test::lazy_ostream::inst;
  local_1a8 = &local_1f8;
  local_1f8 = "";
  local_1b8 = 0;
  local_1c0 = &PTR__lazy_ostream_00186318;
  local_1b0 = &boost::unit_test::lazy_ostream::inst;
  local_1f0 = (undefined1 *)local_218;
  boost::test_tools::tt_detail::report_assertion
            (local_180,&local_1e0,&local_168,0x17,2,2,2,"parser.scheme()",&local_1a0,"\"\"",
             &local_1c0);
  boost::detail::shared_count::~shared_count(&sStack_170);
  if (local_218[0] != local_208) {
    operator_delete(local_218[0],local_208[0] + 1);
  }
  local_60 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/parser_suite.cpp";
  local_58 = "";
  local_70 = &boost::unit_test::basic_cstring<char_const>::null;
  local_68 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_60,0x18);
  local_1d8 = 0;
  local_1e0 = &PTR__lazy_ostream_00186288;
  local_1d0 = &boost::unit_test::lazy_ostream::inst;
  local_1c8 = "";
  local_218[0] = local_208;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_218,parser.current_authority.ptr_,
             parser.current_authority.ptr_ + parser.current_authority.len_);
  iVar1 = std::__cxx11::string::compare((char *)local_218);
  local_180[0] = iVar1 == 0;
  local_178 = 0;
  sStack_170.pi_ = (sp_counted_base *)0x0;
  local_168 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/parser_suite.cpp";
  local_160 = "";
  local_1a0.len_ = local_1a0.len_ & 0xffffffffffffff00;
  local_1a0.ptr_ = (char *)&PTR__lazy_ostream_001862d8;
  local_190 = &boost::unit_test::lazy_ostream::inst;
  local_188 = &local_1f0;
  local_1f8 = "";
  local_1b8 = 0;
  local_1c0 = &PTR__lazy_ostream_00186318;
  local_1b0 = &boost::unit_test::lazy_ostream::inst;
  local_1a8 = &local_1f8;
  local_1f0 = (undefined1 *)local_218;
  boost::test_tools::tt_detail::report_assertion
            (local_180,&local_1e0,&local_168,0x18,2,2,2,"parser.authority()",&local_1a0,"\"\"",
             &local_1c0);
  boost::detail::shared_count::~shared_count(&sStack_170);
  if (local_218[0] != local_208) {
    operator_delete(local_218[0],local_208[0] + 1);
  }
  local_80 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/parser_suite.cpp";
  local_78 = "";
  local_90 = &boost::unit_test::basic_cstring<char_const>::null;
  local_88 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_80,0x19);
  local_1d8 = 0;
  local_1e0 = &PTR__lazy_ostream_00186288;
  local_1d0 = &boost::unit_test::lazy_ostream::inst;
  local_1c8 = "";
  local_218[0] = local_208;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_218,parser.current_path.ptr_,
             parser.current_path.ptr_ + parser.current_path.len_);
  iVar1 = std::__cxx11::string::compare((char *)local_218);
  local_180[0] = iVar1 == 0;
  local_178 = 0;
  sStack_170.pi_ = (sp_counted_base *)0x0;
  local_168 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/parser_suite.cpp";
  local_160 = "";
  local_1a0.len_ = local_1a0.len_ & 0xffffffffffffff00;
  local_1a0.ptr_ = (char *)&PTR__lazy_ostream_001862d8;
  local_190 = &boost::unit_test::lazy_ostream::inst;
  local_188 = &local_1f0;
  local_1f8 = "";
  local_1b8 = 0;
  local_1c0 = &PTR__lazy_ostream_00186318;
  local_1b0 = &boost::unit_test::lazy_ostream::inst;
  local_1a8 = &local_1f8;
  local_1f0 = (undefined1 *)local_218;
  boost::test_tools::tt_detail::report_assertion
            (local_180,&local_1e0,&local_168,0x19,2,2,2,"parser.path()",&local_1a0,"\"\"",&local_1c0
            );
  boost::detail::shared_count::~shared_count(&sStack_170);
  if (local_218[0] != local_208) {
    operator_delete(local_218[0],local_208[0] + 1);
  }
  local_a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/parser_suite.cpp";
  local_98 = "";
  local_b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_a0,0x1a);
  local_1d8 = 0;
  local_1e0 = &PTR__lazy_ostream_00186288;
  local_1d0 = &boost::unit_test::lazy_ostream::inst;
  local_1c8 = "";
  local_218[0] = local_208;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_218,parser.current_query.ptr_,
             parser.current_query.ptr_ + parser.current_query.len_);
  iVar1 = std::__cxx11::string::compare((char *)local_218);
  local_180[0] = iVar1 == 0;
  local_178 = 0;
  sStack_170.pi_ = (sp_counted_base *)0x0;
  local_168 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/parser_suite.cpp";
  local_160 = "";
  local_1a0.len_ = local_1a0.len_ & 0xffffffffffffff00;
  local_1a0.ptr_ = (char *)&PTR__lazy_ostream_001862d8;
  local_190 = &boost::unit_test::lazy_ostream::inst;
  local_188 = &local_1f0;
  local_1f8 = "";
  local_1b8 = 0;
  local_1c0 = &PTR__lazy_ostream_00186318;
  local_1b0 = &boost::unit_test::lazy_ostream::inst;
  local_1a8 = &local_1f8;
  local_1f0 = (undefined1 *)local_218;
  boost::test_tools::tt_detail::report_assertion
            (local_180,&local_1e0,&local_168,0x1a,2,2,2,"parser.query()",&local_1a0,"\"\"",
             &local_1c0);
  boost::detail::shared_count::~shared_count(&sStack_170);
  if (local_218[0] != local_208) {
    operator_delete(local_218[0],local_208[0] + 1);
  }
  local_c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/parser_suite.cpp";
  local_b8 = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_c0,0x1b);
  local_1d8 = 0;
  local_1e0 = &PTR__lazy_ostream_00186288;
  local_1d0 = &boost::unit_test::lazy_ostream::inst;
  local_1c8 = "";
  local_218[0] = local_208;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_218,parser.current_fragment.ptr_,
             parser.current_fragment.ptr_ + parser.current_fragment.len_);
  iVar1 = std::__cxx11::string::compare((char *)local_218);
  local_180[0] = iVar1 == 0;
  local_178 = 0;
  sStack_170.pi_ = (sp_counted_base *)0x0;
  local_168 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/parser_suite.cpp";
  local_160 = "";
  local_1a0.len_ = local_1a0.len_ & 0xffffffffffffff00;
  local_1a0.ptr_ = (char *)&PTR__lazy_ostream_001862d8;
  local_190 = &boost::unit_test::lazy_ostream::inst;
  local_188 = &local_1f0;
  local_1f8 = "";
  local_1b8 = 0;
  local_1c0 = &PTR__lazy_ostream_00186318;
  local_1b0 = &boost::unit_test::lazy_ostream::inst;
  local_1a8 = &local_1f8;
  local_1f0 = (undefined1 *)local_218;
  boost::test_tools::tt_detail::report_assertion
            (local_180,&local_1e0,&local_168,0x1b,2,2,2,"parser.fragment()",&local_1a0,"\"\"",
             &local_1c0);
  boost::detail::shared_count::~shared_count(&sStack_170);
  if (local_218[0] != local_208) {
    operator_delete(local_218[0],local_208[0] + 1);
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(test_empty)
{
    const char input[] = "";
    url::parser parser(input);
    BOOST_REQUIRE_EQUAL(parser.scheme(), "");
    BOOST_REQUIRE_EQUAL(parser.authority(), "");
    BOOST_REQUIRE_EQUAL(parser.path(), "");
    BOOST_REQUIRE_EQUAL(parser.query(), "");
    BOOST_REQUIRE_EQUAL(parser.fragment(), "");
}